

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::setwalletflag(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  bool bVar1;
  reference ppVar2;
  RPCHelpMan *in_RDI;
  undefined1 *puVar3;
  long in_FS_OFFSET;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>
  *it;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  string flags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff438;
  allocator<RPCResult> *this;
  RPCArg *this_00;
  UniValue *in_stack_fffffffffffff440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff450;
  string *in_stack_fffffffffffff468;
  string *in_stack_fffffffffffff470;
  UniValue *in_stack_fffffffffffff478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff480;
  undefined7 in_stack_fffffffffffff488;
  undefined1 in_stack_fffffffffffff48f;
  string *in_stack_fffffffffffff490;
  string *in_stack_fffffffffffff498;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff4a0;
  undefined1 *puVar4;
  string *in_stack_fffffffffffff4a8;
  RPCArg *in_stack_fffffffffffff4b0;
  RPCResult *in_stack_fffffffffffff4b8;
  RPCResult *in_stack_fffffffffffff4c0;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  undefined7 in_stack_fffffffffffff598;
  undefined1 in_stack_fffffffffffff59f;
  RPCHelpMan *this_01;
  allocator<char> local_9bd;
  allocator<char> local_9bc;
  allocator<char> local_9bb;
  allocator<char> local_9ba [2];
  pointer local_9b8;
  pointer pRStack_9b0;
  pointer local_9a8;
  allocator<char> local_99a;
  allocator<char> local_999 [31];
  allocator<char> local_97a;
  allocator<char> local_979 [25];
  undefined8 in_stack_fffffffffffff6a0;
  allocator<char> local_93a;
  allocator<char> local_939 [30];
  allocator<char> local_91b;
  undefined1 local_91a;
  allocator<char> local_919;
  undefined4 local_918;
  undefined1 local_911 [31];
  undefined1 local_8f2;
  vector<RPCArg,_std::allocator<RPCArg>_> local_8f1 [19];
  undefined1 local_720 [408];
  undefined1 local_588 [200];
  undefined1 local_4c0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined1 local_480;
  undefined1 local_47f;
  undefined1 local_380;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined1 local_340;
  undefined1 local_33f;
  undefined1 local_298 [528];
  undefined1 local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffff450);
  local_8f1[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _9_8_ = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>_>_>
          ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>_>_>
                   *)in_stack_fffffffffffff440);
  local_8f1[0].super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _1_8_ = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>_>_>
          ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>_>_>
                 *)in_stack_fffffffffffff440);
  while (bVar1 = std::operator==((_Self *)in_stack_fffffffffffff448,
                                 (_Self *)in_stack_fffffffffffff440), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>_>
                          *)in_stack_fffffffffffff438);
    if ((ppVar2->second & WALLET_FLAG_AVOID_REUSE) != 0) {
      in_stack_fffffffffffff59f =
           std::operator==(in_stack_fffffffffffff448,(char *)in_stack_fffffffffffff440);
      std::operator+((char *)CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
                     in_stack_fffffffffffff480);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_stack_fffffffffffff448,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff440);
      std::__cxx11::string::~string(in_stack_fffffffffffff438);
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wallet::WalletFlags>_>
                  *)in_stack_fffffffffffff438);
  }
  args = local_8f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  results = (RPCResults *)&local_8f2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  examples = (RPCExamples *)local_911;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  local_918 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff448,&in_stack_fffffffffffff440->typ);
  std::operator+((char *)CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
                 in_stack_fffffffffffff480);
  local_380 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff450);
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff438);
  local_340 = 0;
  local_33f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                 (Type)((ulong)in_stack_fffffffffffff4a0 >> 0x20),
                 (Fallback *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  local_91a = 1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_fffffffffffff478,(bool *)in_stack_fffffffffffff470);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff448,in_stack_fffffffffffff440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  local_4c0 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff450);
  local_498 = 0;
  uStack_490 = 0;
  local_488 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff438);
  local_480 = 0;
  local_47f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff4b0,in_stack_fffffffffffff4a8,
                 (Type)((ulong)in_stack_fffffffffffff4a0 >> 0x20),
                 (Fallback *)in_stack_fffffffffffff498,in_stack_fffffffffffff490,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488));
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_fffffffffffff438);
  __l._M_len._0_7_ = in_stack_fffffffffffff488;
  __l._M_array = (iterator)in_stack_fffffffffffff480;
  __l._M_len._7_1_ = in_stack_fffffffffffff48f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff478,__l,
             (allocator_type *)in_stack_fffffffffffff470);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  local_979[1] = (allocator<char>)0x0;
  local_979[2] = (allocator<char>)0x0;
  local_979[3] = (allocator<char>)0x0;
  local_979[4] = (allocator<char>)0x0;
  local_979[5] = (allocator<char>)0x0;
  local_979[6] = (allocator<char>)0x0;
  local_979[7] = (allocator<char>)0x0;
  local_979[8] = (allocator<char>)0x0;
  local_979[9] = (allocator<char>)0x0;
  local_979[10] = (allocator<char>)0x0;
  local_979[0xb] = (allocator<char>)0x0;
  local_979[0xc] = (allocator<char>)0x0;
  local_979[0xd] = (allocator<char>)0x0;
  local_979[0xe] = (allocator<char>)0x0;
  local_979[0xf] = (allocator<char>)0x0;
  local_979[0x10] = (allocator<char>)0x0;
  local_979[0x11] = (allocator<char>)0x0;
  local_979[0x12] = (allocator<char>)0x0;
  local_979[0x13] = (allocator<char>)0x0;
  local_979[0x14] = (allocator<char>)0x0;
  local_979[0x15] = (allocator<char>)0x0;
  local_979[0x16] = (allocator<char>)0x0;
  local_979[0x17] = (allocator<char>)0x0;
  local_979[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff438);
  RPCResult::RPCResult
            (in_stack_fffffffffffff4c0,(Type)((ulong)in_stack_fffffffffffff4b8 >> 0x20),
             &in_stack_fffffffffffff4b0->m_names,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0
             ,SUB81((ulong)in_stack_fffffffffffff498 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  local_999[1] = (allocator<char>)0x0;
  local_999[2] = (allocator<char>)0x0;
  local_999[3] = (allocator<char>)0x0;
  local_999[4] = (allocator<char>)0x0;
  local_999[5] = (allocator<char>)0x0;
  local_999[6] = (allocator<char>)0x0;
  local_999[7] = (allocator<char>)0x0;
  local_999[8] = (allocator<char>)0x0;
  local_999[9] = (allocator<char>)0x0;
  local_999[10] = (allocator<char>)0x0;
  local_999[0xb] = (allocator<char>)0x0;
  local_999[0xc] = (allocator<char>)0x0;
  local_999[0xd] = (allocator<char>)0x0;
  local_999[0xe] = (allocator<char>)0x0;
  local_999[0xf] = (allocator<char>)0x0;
  local_999[0x10] = (allocator<char>)0x0;
  local_999[0x11] = (allocator<char>)0x0;
  local_999[0x12] = (allocator<char>)0x0;
  local_999[0x13] = (allocator<char>)0x0;
  local_999[0x14] = (allocator<char>)0x0;
  local_999[0x15] = (allocator<char>)0x0;
  local_999[0x16] = (allocator<char>)0x0;
  local_999[0x17] = (allocator<char>)0x0;
  local_999[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff438);
  RPCResult::RPCResult
            (in_stack_fffffffffffff4c0,(Type)((ulong)in_stack_fffffffffffff4b8 >> 0x20),
             &in_stack_fffffffffffff4b0->m_names,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0
             ,SUB81((ulong)in_stack_fffffffffffff498 >> 0x38,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  local_9b8 = (pointer)0x0;
  pRStack_9b0 = (pointer)0x0;
  local_9a8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff438);
  this = (allocator<RPCResult> *)((ulong)in_stack_fffffffffffff438 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff4b8,(Type)((ulong)in_stack_fffffffffffff4b0 >> 0x20),
             in_stack_fffffffffffff4a8,SUB81((ulong)in_stack_fffffffffffff4a0 >> 0x38,0),
             in_stack_fffffffffffff498,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff490,
             (bool)in_stack_fffffffffffff48f);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff498 >> 0x38);
  std::allocator<RPCResult>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff488;
  __l_00._M_array = (iterator)in_stack_fffffffffffff480;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff48f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff478,__l_00,
             (allocator_type *)in_stack_fffffffffffff470);
  RPCResult::RPCResult
            (in_stack_fffffffffffff4c0,(Type)((ulong)in_stack_fffffffffffff4b8 >> 0x20),
             &in_stack_fffffffffffff4b0->m_names,in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0
             ,(bool)skip_type_check);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_fffffffffffff4b8,(RPCResult *)in_stack_fffffffffffff4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  HelpExampleCli(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff48f,in_stack_fffffffffffff488),
             (char *)in_stack_fffffffffffff480,(allocator<char> *)in_stack_fffffffffffff478);
  HelpExampleRpc(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  std::operator+(in_stack_fffffffffffff470,in_stack_fffffffffffff468);
  RPCExamples::RPCExamples((RPCExamples *)this,(string *)0x9e59f4);
  this_00 = (RPCArg *)&stack0xfffffffffffff620;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::setwalletflag()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff448,(anon_class_1_0_00000001 *)in_stack_fffffffffffff440);
  RPCHelpMan::RPCHelpMan
            (this_01,&in_RDI->m_name,
             (string *)CONCAT17(in_stack_fffffffffffff59f,in_stack_fffffffffffff598),args,results,
             examples,(RPCMethodImpl *)in_stack_fffffffffffff6a0);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_00);
  RPCExamples::~RPCExamples((RPCExamples *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_9bd);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_9bc);
  std::__cxx11::string::~string(&this_00->m_names);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_9bb);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_9ba);
  RPCResults::~RPCResults((RPCResults *)this_00);
  RPCResult::~RPCResult((RPCResult *)this_00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff448);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_00);
  puVar4 = local_720;
  puVar3 = local_588;
  do {
    puVar3 = puVar3 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_00);
  } while (puVar3 != puVar4);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff448);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_99a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_999);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff448);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_97a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_979);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff448);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff6a6);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff6a7);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_93a);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(local_939);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff448);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_00);
  puVar4 = local_298;
  puVar3 = local_88;
  do {
    puVar3 = puVar3 + -0x108;
    RPCArg::~RPCArg(this_00);
  } while (puVar3 != puVar4);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_91b);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  UniValue::~UniValue((UniValue *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator(&local_919);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_00);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_911);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f2);
  std::__cxx11::string::~string(&this_00->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_8f1);
  std::__cxx11::string::~string(&this_00->m_names);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan setwalletflag()
{
            std::string flags;
            for (auto& it : WALLET_FLAG_MAP)
                if (it.second & MUTABLE_WALLET_FLAGS)
                    flags += (flags == "" ? "" : ", ") + it.first;

    return RPCHelpMan{"setwalletflag",
                "\nChange the state of the given wallet flag for a wallet.\n",
                {
                    {"flag", RPCArg::Type::STR, RPCArg::Optional::NO, "The name of the flag to change. Current available flags: " + flags},
                    {"value", RPCArg::Type::BOOL, RPCArg::Default{true}, "The new state."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "flag_name", "The name of the flag that was modified"},
                        {RPCResult::Type::BOOL, "flag_state", "The new state of the flag"},
                        {RPCResult::Type::STR, "warnings", /*optional=*/true, "Any warnings associated with the change"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("setwalletflag", "avoid_reuse")
                  + HelpExampleRpc("setwalletflag", "\"avoid_reuse\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    std::string flag_str = request.params[0].get_str();
    bool value = request.params[1].isNull() || request.params[1].get_bool();

    if (!WALLET_FLAG_MAP.count(flag_str)) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Unknown wallet flag: %s", flag_str));
    }

    auto flag = WALLET_FLAG_MAP.at(flag_str);

    if (!(flag & MUTABLE_WALLET_FLAGS)) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Wallet flag is immutable: %s", flag_str));
    }

    UniValue res(UniValue::VOBJ);

    if (pwallet->IsWalletFlagSet(flag) == value) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Wallet flag is already set to %s: %s", value ? "true" : "false", flag_str));
    }

    res.pushKV("flag_name", flag_str);
    res.pushKV("flag_state", value);

    if (value) {
        pwallet->SetWalletFlag(flag);
    } else {
        pwallet->UnsetWalletFlag(flag);
    }

    if (flag && value && WALLET_FLAG_CAVEATS.count(flag)) {
        res.pushKV("warnings", WALLET_FLAG_CAVEATS.at(flag));
    }

    return res;
},
    };
}